

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O3

bool __thiscall uWS::protocol::isValidUtf8(protocol *this,uchar *s,size_t length)

{
  protocol pVar1;
  byte bVar2;
  protocol *ppVar3;
  protocol *ppVar4;
  byte bVar5;
  protocol *ppVar6;
  
  bVar5 = (byte)length;
  if (s == (uchar *)0x0) {
    bVar2 = 1;
  }
  else {
    ppVar6 = (protocol *)(s + (long)this);
    do {
      ppVar3 = this + 4;
      if ((ppVar6 < ppVar3) || ((*(uint *)this & 0x80808080) != 0)) {
        ppVar3 = this + 2;
        goto LAB_00132cc4;
      }
      this = ppVar3;
    } while (ppVar3 != ppVar6);
    bVar5 = 0;
    bVar2 = 1;
  }
  goto LAB_00132e20;
  while (ppVar4 = ppVar3 + -1, ppVar3 = ppVar3 + 1, ppVar4 != ppVar6) {
LAB_00132cc4:
    pVar1 = ppVar3[-2];
    if ((char)pVar1 < '\0') {
      if (((((byte)pVar1 & 0x60) == 0x40) && (ppVar3 + -1 < ppVar6)) &&
         (bVar2 = 0, ((byte)pVar1 & 0xde) != 0xc0)) {
        bVar5 = 0;
      }
      else {
        bVar2 = 0;
        bVar5 = 0;
      }
      goto LAB_00132e20;
    }
  }
  bVar5 = 1;
  bVar2 = 0;
LAB_00132e20:
  return (bool)(bVar2 | bVar5 & 1);
}

Assistant:

static bool isValidUtf8(unsigned char *s, size_t length)
{
    for (unsigned char *e = s + length; s != e; ) {
        if (s + 4 <= e) {
            uint32_t tmp;
            memcpy(&tmp, s, 4);
            if ((tmp & 0x80808080) == 0) {
                s += 4;
                continue;
            }
        }

        while (!(*s & 0x80)) {
            if (++s == e) {
                return true;
            }
        }

        if ((s[0] & 0x60) == 0x40) {
            if (s + 1 >= e || (s[1] & 0xc0) != 0x80 || (s[0] & 0xfe) == 0xc0) {
                return false;
            }
            s += 2;
        } else if ((s[0] & 0xf0) == 0xe0) {
            if (s + 2 >= e || (s[1] & 0xc0) != 0x80 || (s[2] & 0xc0) != 0x80 ||
                    (s[0] == 0xe0 && (s[1] & 0xe0) == 0x80) || (s[0] == 0xed && (s[1] & 0xe0) == 0xa0)) {
                return false;
            }
            s += 3;
        } else if ((s[0] & 0xf8) == 0xf0) {
            if (s + 3 >= e || (s[1] & 0xc0) != 0x80 || (s[2] & 0xc0) != 0x80 || (s[3] & 0xc0) != 0x80 ||
                    (s[0] == 0xf0 && (s[1] & 0xf0) == 0x80) || (s[0] == 0xf4 && s[1] > 0x8f) || s[0] > 0xf4) {
                return false;
            }
            s += 4;
        } else {
            return false;
        }
    }
    return true;
}